

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

void * region_join(region *region,size_t size)

{
  small_stats *psVar1;
  rlist *prVar2;
  void *__dest;
  void *pvVar3;
  ulong __n;
  rlist *prVar4;
  size_t __n_00;
  
  if ((region->slabs).stats.used < size) {
    __assert_fail("size <= region_used(region)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/region.c"
                  ,0x71,"void *region_join(struct region *, size_t)");
  }
  if (region->reserved != 0) {
    __assert_fail("!region->reserved",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/region.c"
                  ,0x72,"void *region_join(struct region *, size_t)");
  }
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/region.c"
                  ,0x73,"void *region_join(struct region *, size_t)");
  }
  prVar4 = (region->slabs).slabs.next;
  if (*(uint *)&prVar4[2].prev < size) {
    prVar2 = (region->slabs).slabs.next;
    if ((((slab_list *)prVar2 == &region->slabs) && (prVar2 == (region->slabs).slabs.prev)) ||
       ((*(int *)&prVar2[1].prev - *(uint *)&prVar2[2].prev) - 0x38 < size)) {
      __dest = (void *)0x0;
    }
    else {
      __dest = (void *)((long)&prVar2[2].next + (ulong)*(uint *)&prVar2[2].prev);
    }
    if (__dest == (void *)0x0) {
      __dest = region_reserve_slow(region,size);
    }
    if (__dest == (void *)0x0) {
      __dest = (void *)0x0;
    }
    else {
      region->reserved = 1;
      __n_00 = size;
      do {
        __n = (ulong)*(uint *)&prVar4[2].prev;
        if (__n_00 < __n) {
          memcpy(__dest,(void *)((long)prVar4 + (__n - __n_00) + 0x28),__n_00);
          break;
        }
        memcpy((void *)((long)__dest + (__n_00 - __n)),&prVar4[2].next,__n);
        prVar2 = prVar4 + 2;
        prVar4 = prVar4->next;
        __n_00 = __n_00 - *(uint *)&prVar2->prev;
      } while (__n_00 != 0);
      region->reserved = 0;
      prVar4 = (region->slabs).slabs.next;
      if (((((slab_list *)prVar4 != &region->slabs) || (prVar4 != (region->slabs).slabs.prev)) &&
          (size <= (*(int *)&prVar4[1].prev - *(int *)&prVar4[2].prev) - 0x38)) ||
         (pvVar3 = region_reserve_slow(region,size), pvVar3 != (void *)0x0)) {
        region->reserved = 1;
        prVar4 = (region->slabs).slabs.next;
        if ((*(int *)&prVar4[1].prev - *(int *)&prVar4[2].prev) - 0x38 < size) {
          __assert_fail("size <= rslab_unused(slab)",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/region.h"
                        ,0xf8,"void *region_alloc(struct region *, size_t)");
        }
        if (region->on_alloc_cb != (region_on_alloc_f)0x0) {
          (*region->on_alloc_cb)(region,size,region->cb_arg);
        }
        psVar1 = &(region->slabs).stats;
        psVar1->used = psVar1->used + size;
        *(int *)&prVar4[2].prev = *(int *)&prVar4[2].prev + (int)size;
        region->reserved = 0;
      }
    }
  }
  else {
    __dest = (void *)((long)prVar4 + (*(uint *)&prVar4[2].prev - size) + 0x28);
  }
  return __dest;
}

Assistant:

void *
region_join(struct region *region, size_t size)
{
	assert(size <= region_used(region));
	assert(!region->reserved);
	assert(size > 0);
	struct rslab *slab = rlist_first_entry(&region->slabs.slabs,
					       struct rslab,
					       slab.next_in_list);

	if (slab->used >= size) {
		/* Don't move stuff if it's in a single chunk. */
		return (char *) rslab_data(slab) + slab->used - size;
	}
	/**
	 * Use region_reserve() to ensure slab->size is not
	 * changed when the joined region is in the same slab
	 * as the final chunk.
	 */
	char *ptr = region_reserve(region, size);
	size_t offset = size;
	if (ptr == NULL)
		return NULL;
	/*
	 * Copy data from last chunk to first, i.e. in the reverse order.
	 */
	while (offset > 0 && slab->used <= offset) {
		memcpy(ptr + offset - slab->used, rslab_data(slab), slab->used);
		offset -= slab->used;
		slab = rlist_next_entry(slab, slab.next_in_list);
	}
	if (offset > 0)
		memcpy(ptr, rslab_data(slab) + slab->used - offset, offset);
	region_alloc(region, size);
	return ptr;
}